

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

uint32_t __thiscall spvtools::opt::InlinePass::GetFalseId(InlinePass *this)

{
  uint32_t uVar1;
  uint32_t result_id;
  
  if (this->false_id_ != 0) {
    return this->false_id_;
  }
  uVar1 = Module::GetGlobalValue
                    ((((this->super_Pass).context_)->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                     OpConstantFalse);
  this->false_id_ = uVar1;
  if (uVar1 != 0) {
    return uVar1;
  }
  uVar1 = Module::GetGlobalValue
                    ((((this->super_Pass).context_)->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,OpTypeBool)
  ;
  if (uVar1 == 0) {
    uVar1 = IRContext::TakeNextId((this->super_Pass).context_);
    if (uVar1 == 0) {
      return 0;
    }
    Module::AddGlobalValue
              ((((this->super_Pass).context_)->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,OpTypeBool,uVar1,
               0);
  }
  result_id = IRContext::TakeNextId((this->super_Pass).context_);
  this->false_id_ = result_id;
  if (result_id == 0) {
    return 0;
  }
  Module::AddGlobalValue
            ((((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,OpConstantFalse,
             result_id,uVar1);
  return this->false_id_;
}

Assistant:

uint32_t InlinePass::GetFalseId() {
  if (false_id_ != 0) return false_id_;
  false_id_ = get_module()->GetGlobalValue(spv::Op::OpConstantFalse);
  if (false_id_ != 0) return false_id_;
  uint32_t boolId = get_module()->GetGlobalValue(spv::Op::OpTypeBool);
  if (boolId == 0) {
    boolId = context()->TakeNextId();
    if (boolId == 0) {
      return 0;
    }
    get_module()->AddGlobalValue(spv::Op::OpTypeBool, boolId, 0);
  }
  false_id_ = context()->TakeNextId();
  if (false_id_ == 0) {
    return 0;
  }
  get_module()->AddGlobalValue(spv::Op::OpConstantFalse, false_id_, boolId);
  return false_id_;
}